

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O3

void __thiscall
t_delphi_generator::generate_delphi_clear_union_value
          (t_delphi_generator *this,ostream *out,string cls_prefix,string name,t_type *type,
          t_field *tfield,string *fieldPrefix,bool is_xception_class,bool is_union,
          bool is_xception_factory,string xception_factory_name)

{
  t_type *ttype;
  int iVar1;
  ostream *poVar2;
  undefined7 in_register_00000089;
  t_field *tfield_00;
  string local_70;
  string local_50;
  
  tfield_00 = (t_field *)CONCAT71(in_register_00000089,is_xception_class);
  ttype = tfield_00->type_;
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
  poVar2 = indent_impl(this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"if F__isset_",0xc);
  prop_name_abi_cxx11_(&local_70,this,tfield_00,cls_prefix._M_string_length._0_1_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," then begin",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this->indent_impl_ = this->indent_impl_ + 1;
  poVar2 = indent_impl(this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"F__isset_",9);
  prop_name_abi_cxx11_(&local_70,this,tfield_00,cls_prefix._M_string_length._0_1_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," := False;",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  poVar2 = indent_impl(this,out);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)cls_prefix._M_dataplus._M_p,
                      *(long *)(cls_prefix._M_dataplus._M_p + 8));
  prop_name_abi_cxx11_(&local_70,this,tfield_00,cls_prefix._M_string_length._0_1_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," := ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Default( ",9);
  type_name_abi_cxx11_(&local_50,this,ttype,false,true,SUB41(iVar1,0),true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this->indent_impl_ = this->indent_impl_ + -1;
  poVar2 = indent_impl(this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"end;",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_delphi_generator::generate_delphi_clear_union_value(ostream& out,
                                                           std::string cls_prefix,
                                                           std::string name,
                                                           t_type* type,
                                                           t_field* tfield,
                                                           std::string fieldPrefix,
                                                           bool is_xception_class,
                                                           bool is_union,
                                                           bool is_xception_factory,
                                                           std::string xception_factory_name) {
  (void)cls_prefix;
  (void)name;
  (void)type;
  (void)is_union;
  (void)is_xception_factory;
  (void)xception_factory_name;

  t_type* ftype = tfield->get_type();
  bool is_xception = ftype->is_xception();

  indent_impl(out) << "if F__isset_" << prop_name(tfield, is_xception_class) << " then begin"
                   << endl;
  indent_up_impl();
  indent_impl(out) << "F__isset_" << prop_name(tfield, is_xception_class) << " := False;" << endl;
  indent_impl(out) << fieldPrefix << prop_name(tfield, is_xception_class) << " := "
                   << "Default( " << type_name(ftype, false, true, is_xception, true) << ");"
                   << endl;
  indent_down_impl();
  indent_impl(out) << "end;" << endl;
}